

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_6b0f33::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  int iVar1;
  int *piVar2;
  int r;
  int iVar3;
  int *piVar4;
  
  iVar3 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar3;
  iVar3 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,count);
  this->Stop = iVar3;
  iVar3 = (iVar3 - this->Start) + 1;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->super_TransformSelectorIndexes).Indexes,
             (long)(int)((iVar3 / this->Step + 1) - (uint)(iVar3 % this->Step == 0)));
  iVar3 = this->Start;
  iVar1 = this->Step;
  piVar2 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar4 = (this->super_TransformSelectorIndexes).Indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    *piVar4 = iVar3;
    iVar3 = iVar3 + iVar1;
  }
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start, step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }